

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# d_main.cpp
# Opt level: O3

void D_Display(void)

{
  double dVar1;
  double dVar2;
  double dVar3;
  FFont *font;
  DFrameBuffer *this;
  undefined8 *puVar4;
  char hw2d;
  int iVar5;
  uint uVar6;
  int iVar7;
  FTextureID FVar8;
  long lVar9;
  long *plVar10;
  FTexture *pFVar11;
  long lVar12;
  undefined8 *puVar13;
  uint uVar14;
  byte bVar15;
  EHudState state;
  timespec ts;
  DAngle local_38;
  
  if (nodrawers) {
    return;
  }
  if (screen == (DFrameBuffer *)0x0) {
    return;
  }
  clock_gettime(1,(timespec *)&ts);
  lVar9 = (long)consoleplayer;
  plVar10 = &DAT_00a60408 + lVar9 * 0x54;
  lVar12 = *plVar10;
  if (lVar12 == 0) {
LAB_004b89a7:
    lVar12 = (&players)[lVar9 * 0x54];
    (&DAT_00a60408)[lVar9 * 0x54] = lVar12;
  }
  else if ((*(byte *)(lVar12 + 0x20) & 0x20) != 0) {
    *plVar10 = 0;
    goto LAB_004b89a7;
  }
  dVar2 = (double)ts.tv_nsec;
  dVar3 = (double)ts.tv_sec;
  if (viewactive == true) {
    local_38.Degrees = 90.0;
    if (lVar12 != 0) {
      if ((*(byte *)(lVar12 + 0x20) & 0x20) == 0) {
        local_38.Degrees = 90.0;
        if (*(long *)(lVar12 + 0x200) != 0) {
          local_38.Degrees = (double)*(float *)(*(long *)(lVar12 + 0x200) + 0x5c);
        }
      }
      else {
        *plVar10 = 0;
        local_38.Degrees = 90.0;
      }
    }
    R_SetFOV(&local_38);
  }
  if ((setmodeneeded == true) &&
     (iVar5 = (*Video->_vptr_IVideo[7])
                        (Video,(ulong)(uint)NewWidth,(ulong)(uint)NewHeight,(ulong)(uint)NewBits),
     (char)iVar5 != '\0')) {
    setsizeneeded = true;
    if (StatusBar != (DBaseStatusBar *)0x0) {
      (*(StatusBar->super_DObject)._vptr_DObject[0xe])();
    }
    C_NewModeAdjust();
    ST_LoadCrosshair(true);
    AM_NewResolution();
    if (vid_cursor.super_FBaseCVar.m_Callback != (_func_void_FBaseCVar_ptr *)0x0) {
      (*vid_cursor.super_FBaseCVar.m_Callback)(&vid_cursor.super_FBaseCVar);
    }
  }
  RenderTarget = (DCanvas *)screen;
  if ((setsizeneeded == true) && (StatusBar != (DBaseStatusBar *)0x0)) {
    R_ExecuteSetViewSize();
  }
  setmodeneeded = false;
  iVar5 = (*(screen->super_DSimpleCanvas).super_DCanvas.super_DObject._vptr_DObject[8])(screen,0);
  if ((char)iVar5 != '\0') {
    ST_SetNeedRefresh();
    V_SetBorderNeedRefresh();
  }
  if (NoWipe == 0) {
    bVar15 = 1;
    if (((gamestate != wipegamestate) && (gamestate != GS_FULLCONSOLE)) &&
       (gamestate != GS_TITLELEVEL)) {
      V_SetBorderNeedRefresh();
      uVar6 = wipetype.Value;
      if ((uint)(wipegamestate + GS_FULLCONSOLE) < 3) {
        uVar6 = wipegamestate + GS_HIDECONSOLE;
      }
      iVar5 = (*(screen->super_DSimpleCanvas).super_DCanvas.super_DObject._vptr_DObject[0x2a])
                        (screen,(ulong)uVar6);
      wipegamestate = gamestate;
      bVar15 = (byte)iVar5 ^ 1;
    }
  }
  else {
    V_SetBorderNeedRefresh();
    NoWipe = NoWipe + -1;
    wipegamestate = gamestate;
    bVar15 = 1;
  }
  uVar6 = I_FPSTime();
  FTextureManager::UpdateAnimations(&TexMan,uVar6);
  R_UpdateSky(uVar6);
  hw2d = false;
  switch(gamestate) {
  case GS_LEVEL:
  case GS_TITLELEVEL:
    if (gametic == 0) {
      hw2d = false;
      goto switchD_004b8ba4_caseD_5;
    }
    if (StatusBar != (DBaseStatusBar *)0x0) {
      ts.tv_sec = 0;
      ts.tv_nsec = 0;
      (*(StatusBar->super_DObject)._vptr_DObject[0xc])();
    }
    (*(screen->super_DSimpleCanvas).super_DCanvas.super_DObject._vptr_DObject[0x24])();
    (*Renderer->_vptr_FRenderer[4])(Renderer,&players + (long)consoleplayer * 0x54);
    iVar5 = (*(screen->super_DSimpleCanvas).super_DCanvas.super_DObject._vptr_DObject[0x25])();
    hw2d = (char)iVar5;
    if (hw2d != '\0') {
      ST_SetNeedRefresh();
      V_SetBorderNeedRefresh();
    }
    (*Renderer->_vptr_FRenderer[7])();
    (*(screen->super_DSimpleCanvas).super_DCanvas.super_DObject._vptr_DObject[0x26])();
    iVar5 = ST_Y;
    if (automapactive == true) {
      if ((hud_althud.Value == true) &&
         (viewheight == (screen->super_DSimpleCanvas).super_DCanvas.Height)) {
        ST_Y = viewheight;
      }
      AM_Drawer();
    }
    ST_Y = iVar5;
    if (((automapactive & 1U) == 0) || (viewactive == true)) {
      V_RefreshViewBorder();
    }
    iVar5 = (screen->super_DSimpleCanvas).super_DCanvas.Height;
    if (((hud_althud.Value == true) && (viewheight == iVar5)) && (10 < screenblocks.Value)) {
      state = HUD_AltHud;
      DBaseStatusBar::DrawBottomStuff(StatusBar,HUD_AltHud);
      if ((DrawFSHUD != false) || (automapactive == true)) {
        DrawHUD();
      }
    }
    else {
      if (((viewheight == iVar5) && (viewactive == true)) && (10 < screenblocks.Value)) {
        state = HUD_None - DrawFSHUD;
      }
      else {
        state = HUD_StatusBar;
      }
      DBaseStatusBar::DrawBottomStuff(StatusBar,state);
    }
    (*(StatusBar->super_DObject)._vptr_DObject[8])(StatusBar,(ulong)state);
    DBaseStatusBar::DrawTopStuff(StatusBar,state);
    break;
  case GS_INTERMISSION:
    (*(screen->super_DSimpleCanvas).super_DCanvas.super_DObject._vptr_DObject[0x24])(screen,0,0,0,0)
    ;
    iVar5 = (*(screen->super_DSimpleCanvas).super_DCanvas.super_DObject._vptr_DObject[0x25])
                      (screen,0);
    hw2d = (char)iVar5;
    WI_Drawer();
    break;
  case GS_FINALE:
    (*(screen->super_DSimpleCanvas).super_DCanvas.super_DObject._vptr_DObject[0x24])(screen,0,0,0,0)
    ;
    iVar5 = (*(screen->super_DSimpleCanvas).super_DCanvas.super_DObject._vptr_DObject[0x25])
                      (screen,0);
    hw2d = (char)iVar5;
    F_Drawer();
    break;
  case GS_DEMOSCREEN:
    (*(screen->super_DSimpleCanvas).super_DCanvas.super_DObject._vptr_DObject[0x24])(screen,0,0,0,0)
    ;
    iVar5 = (*(screen->super_DSimpleCanvas).super_DCanvas.super_DObject._vptr_DObject[0x25])
                      (screen,0);
    hw2d = (char)iVar5;
    D_PageDrawer();
    break;
  case GS_FULLCONSOLE:
    (*(screen->super_DSimpleCanvas).super_DCanvas.super_DObject._vptr_DObject[0x24])(screen,0,0,0,0)
    ;
    (*(screen->super_DSimpleCanvas).super_DCanvas.super_DObject._vptr_DObject[0x25])(screen,0);
    C_DrawConsole(false);
    M_Drawer();
    (*(screen->super_DSimpleCanvas).super_DCanvas.super_DObject._vptr_DObject[0x19])();
    return;
  default:
    goto switchD_004b8ba4_caseD_5;
  }
  CT_Drawer();
switchD_004b8ba4_caseD_5:
  if (((paused != 0) || (pauseext == true)) && (menuactive == MENU_Off)) {
    FString::FString((FString *)&ts,"By ");
    pFVar11 = FTextureManager::operator()(&TexMan,gameinfo.PauseSign.Chars);
    dVar1 = (pFVar11->Scale).X;
    uVar6 = (uint)((double)((uint)pFVar11->Width * 2) / dVar1);
    uVar14 = (uint)((double)(pFVar11->LeftOffset * 2) / dVar1);
    DCanvas::DrawTexture
              ((DCanvas *)screen,pFVar11,
               (double)(int)(((uVar14 & 1) + ((int)uVar14 >> 1)) * CleanXfac +
                            (int)((screen->super_DSimpleCanvas).super_DCanvas.Width -
                                 ((uVar6 & 1) + ((int)uVar6 >> 1)) * CleanXfac) / 2),4.0,0x40001393,
               1,0);
    lVar12 = (long)paused;
    if ((lVar12 != 0) && (multiplayer == true)) {
      puVar4 = (undefined8 *)
               ((ulong)(((&pr_dmspawn)[lVar12 * 6].sfmt.u[0x10] - 1 & 0x1cf) * 0x18) +
               (&pr_dmspawn)[lVar12 * 6].sfmt.u64[6]);
      do {
        puVar13 = puVar4;
        puVar4 = (undefined8 *)*puVar13;
      } while (*(int *)(puVar13 + 1) != 0x1cf);
      FString::operator+=((FString *)&ts,*(char **)(puVar13[2] + 0x28));
      this = screen;
      font = SmallFont;
      iVar5 = (screen->super_DSimpleCanvas).super_DCanvas.Width;
      iVar7 = FFont::StringWidth(SmallFont,(BYTE *)ts.tv_sec);
      uVar6 = (uint)((double)((uint)pFVar11->Height * 2) / (pFVar11->Scale).Y);
      DCanvas::DrawText((DCanvas *)this,font,6,(iVar5 - iVar7 * CleanXfac) / 2,
                        ((uVar6 & 1) + ((int)uVar6 >> 1)) * CleanYfac + 4,(char *)ts.tv_sec,
                        0x40001393,1,0);
    }
    FString::~FString((FString *)&ts);
  }
  if (D_DrawIcon != (char *)0x0) {
    FVar8 = FTextureManager::CheckForTexture(&TexMan,D_DrawIcon,8,1);
    D_DrawIcon = (char *)0x0;
    if (0 < FVar8.texnum) {
      pFVar11 = TexMan.Textures.Array[(uint)FVar8.texnum].Texture;
      uVar6 = (uint)((double)((uint)pFVar11->Width * 2) / (pFVar11->Scale).X);
      uVar14 = (uint)((double)((uint)pFVar11->Height * 2) / (pFVar11->Scale).Y);
      DCanvas::DrawTexture
                ((DCanvas *)screen,pFVar11,
                 (double)(0xa0 - (int)((uVar6 & 1) + ((int)uVar6 >> 1)) / 2),
                 (double)(100 - (int)((uVar14 & 1) + ((int)uVar14 >> 1)) / 2),0x40001391,1,0);
    }
    NoWipe = 10;
  }
  if (((long)texture_browse_index.Value != -1) &&
     (texture_browse_index.Value < (int)TexMan.Textures.Count)) {
    if ((uint)texture_browse_index.Value < TexMan.Textures.Count) {
      pFVar11 = TexMan.Textures.Array[texture_browse_index.Value].Texture;
    }
    else {
      pFVar11 = (FTexture *)0x0;
    }
    DCanvas::DrawTexture((DCanvas *)screen,pFVar11,0.0,0.0,0x40001391,1,0x4000139b,0,0x4000139c,0,0)
    ;
    DCanvas::DrawText((DCanvas *)screen,ConFont,9,0,
                      (screen->super_DSimpleCanvas).super_DCanvas.Height - ConFont->FontHeight,
                      (pFVar11->Name).Chars,0);
  }
  if (snd_drawoutput.Value != 0) {
    (*GSnd->_vptr_SoundRenderer[0x20])();
  }
  if ((bVar15 | NoWipe < 0) == 1) {
    NetUpdate();
    C_DrawConsole((bool)hw2d);
    M_Drawer();
    FStat::PrintStat();
    (*(screen->super_DSimpleCanvas).super_DCanvas.super_DObject._vptr_DObject[0x19])();
  }
  else {
    (*GSnd->_vptr_SoundRenderer[0x16])(GSnd,1,1);
    (*I_FreezeTime)(true);
    (*(screen->super_DSimpleCanvas).super_DCanvas.super_DObject._vptr_DObject[0x2b])();
    uVar6 = I_MSTime();
    NetUpdate();
    do {
      do {
        I_WaitVBL(cl_wipe_delay.Value);
        uVar14 = I_MSTime();
      } while ((uVar14 - uVar6) * 0x28 < 1000);
      iVar5 = (*(screen->super_DSimpleCanvas).super_DCanvas.super_DObject._vptr_DObject[0x2c])
                        (screen,1);
      C_DrawConsole((bool)hw2d);
      M_Drawer();
      (*(screen->super_DSimpleCanvas).super_DCanvas.super_DObject._vptr_DObject[0x19])();
      NetUpdate();
      uVar6 = uVar14;
    } while ((char)iVar5 == '\0');
    (*(screen->super_DSimpleCanvas).super_DCanvas.super_DObject._vptr_DObject[0x2d])();
    (*I_FreezeTime)(false);
    (*GSnd->_vptr_SoundRenderer[0x16])(GSnd,0,1);
  }
  clock_gettime(1,(timespec *)&ts);
  FrameCycles.Sec = (0.0 - (dVar2 * 1e-09 + dVar3)) + (double)ts.tv_nsec * 1e-09 + (double)ts.tv_sec
  ;
  return;
}

Assistant:

void D_Display ()
{
	bool wipe;
	bool hw2d;

	if (nodrawers || screen == NULL)
		return; 				// for comparative timing / profiling
	
	cycle_t cycles;
	
	cycles.Reset();
	cycles.Clock();

	if (players[consoleplayer].camera == NULL)
	{
		players[consoleplayer].camera = players[consoleplayer].mo;
	}

	if (viewactive)
	{
		R_SetFOV (players[consoleplayer].camera && players[consoleplayer].camera->player ?
			players[consoleplayer].camera->player->FOV : 90.f);
	}

	// [RH] change the screen mode if needed
	if (setmodeneeded)
	{
		// Change screen mode.
		if (Video->SetResolution (NewWidth, NewHeight, NewBits))
		{
			// Recalculate various view parameters.
			setsizeneeded = true;
			// Let the status bar know the screen size changed
			if (StatusBar != NULL)
			{
				StatusBar->ScreenSizeChanged ();
			}
			// Refresh the console.
			C_NewModeAdjust ();
			// Reload crosshair if transitioned to a different size
			ST_LoadCrosshair (true);
			AM_NewResolution ();
			// Reset the mouse cursor in case the bit depth changed
			vid_cursor.Callback();
		}
	}

	RenderTarget = screen;

	// change the view size if needed
	if (setsizeneeded && StatusBar != NULL)
	{
		R_ExecuteSetViewSize ();
	}
	setmodeneeded = false;

	if (screen->Lock (false))
	{
		ST_SetNeedRefresh();
		V_SetBorderNeedRefresh();
	}

	// [RH] Allow temporarily disabling wipes
	if (NoWipe)
	{
		V_SetBorderNeedRefresh();
		NoWipe--;
		wipe = false;
		wipegamestate = gamestate;
	}
	else if (gamestate != wipegamestate && gamestate != GS_FULLCONSOLE && gamestate != GS_TITLELEVEL)
	{ // save the current screen if about to wipe
		V_SetBorderNeedRefresh();
		switch (wipegamestate)
		{
		default:
			wipe = screen->WipeStartScreen (wipetype);
			break;

		case GS_FORCEWIPEFADE:
			wipe = screen->WipeStartScreen (wipe_Fade);
			break;

		case GS_FORCEWIPEBURN:
			wipe = screen->WipeStartScreen (wipe_Burn);
			break;

		case GS_FORCEWIPEMELT:
			wipe = screen->WipeStartScreen (wipe_Melt);
			break;
		}
		wipegamestate = gamestate;
	}
	else
	{
		wipe = false;
	}

	hw2d = false;


	{
		unsigned int nowtime = I_FPSTime();
		TexMan.UpdateAnimations(nowtime);
		R_UpdateSky(nowtime);
		switch (gamestate)
		{
		case GS_FULLCONSOLE:
			screen->SetBlendingRect(0,0,0,0);
			hw2d = screen->Begin2D(false);
			C_DrawConsole (false);
			M_Drawer ();
			screen->Update ();
			return;

		case GS_LEVEL:
		case GS_TITLELEVEL:
			if (!gametic)
				break;

			if (StatusBar != NULL)
			{
				float blend[4] = { 0, 0, 0, 0 };
				StatusBar->BlendView (blend);
			}
			screen->SetBlendingRect(viewwindowx, viewwindowy,
				viewwindowx + viewwidth, viewwindowy + viewheight);

			Renderer->RenderView(&players[consoleplayer]);

			if ((hw2d = screen->Begin2D(viewactive)))
			{
				// Redraw everything every frame when using 2D accel
				ST_SetNeedRefresh();
				V_SetBorderNeedRefresh();
			}
			Renderer->DrawRemainingPlayerSprites();
			screen->DrawBlendingRect();
			if (automapactive)
			{
				int saved_ST_Y = ST_Y;
				if (hud_althud && viewheight == SCREENHEIGHT)
				{
					ST_Y = viewheight;
				}
				AM_Drawer ();
				ST_Y = saved_ST_Y;
			}
			if (!automapactive || viewactive)
			{
				V_RefreshViewBorder ();
			}

			if (hud_althud && viewheight == SCREENHEIGHT && screenblocks > 10)
			{
				StatusBar->DrawBottomStuff (HUD_AltHud);
				if (DrawFSHUD || automapactive) DrawHUD();
				StatusBar->Draw (HUD_AltHud);
				StatusBar->DrawTopStuff (HUD_AltHud);
			}
			else 
			if (viewheight == SCREENHEIGHT && viewactive && screenblocks > 10)
			{
				EHudState state = DrawFSHUD ? HUD_Fullscreen : HUD_None;
				StatusBar->DrawBottomStuff (state);
				StatusBar->Draw (state);
				StatusBar->DrawTopStuff (state);
			}
			else
			{
				StatusBar->DrawBottomStuff (HUD_StatusBar);
				StatusBar->Draw (HUD_StatusBar);
				StatusBar->DrawTopStuff (HUD_StatusBar);
			}
			CT_Drawer ();
			break;

		case GS_INTERMISSION:
			screen->SetBlendingRect(0,0,0,0);
			hw2d = screen->Begin2D(false);
			WI_Drawer ();
			CT_Drawer ();
			break;

		case GS_FINALE:
			screen->SetBlendingRect(0,0,0,0);
			hw2d = screen->Begin2D(false);
			F_Drawer ();
			CT_Drawer ();
			break;

		case GS_DEMOSCREEN:
			screen->SetBlendingRect(0,0,0,0);
			hw2d = screen->Begin2D(false);
			D_PageDrawer ();
			CT_Drawer ();
			break;

		default:
			break;
		}
	}
	// draw pause pic
	if ((paused || pauseext) && menuactive == MENU_Off)
	{
		FTexture *tex;
		int x;
		FString pstring = "By ";

		tex = TexMan(gameinfo.PauseSign);
		x = (SCREENWIDTH - tex->GetScaledWidth() * CleanXfac)/2 +
			tex->GetScaledLeftOffset() * CleanXfac;
		screen->DrawTexture (tex, x, 4, DTA_CleanNoMove, true, TAG_DONE);
		if (paused && multiplayer)
		{
			pstring += players[paused - 1].userinfo.GetName();
			screen->DrawText(SmallFont, CR_RED,
				(screen->GetWidth() - SmallFont->StringWidth(pstring)*CleanXfac) / 2,
				(tex->GetScaledHeight() * CleanYfac) + 4, pstring, DTA_CleanNoMove, true, TAG_DONE);
		}
	}

	// [RH] Draw icon, if any
	if (D_DrawIcon)
	{
		FTextureID picnum = TexMan.CheckForTexture (D_DrawIcon, FTexture::TEX_MiscPatch);

		D_DrawIcon = NULL;
		if (picnum.isValid())
		{
			FTexture *tex = TexMan[picnum];
			screen->DrawTexture (tex, 160 - tex->GetScaledWidth()/2, 100 - tex->GetScaledHeight()/2,
				DTA_320x200, true, TAG_DONE);
		}
		NoWipe = 10;
	}

	if (-1 != texture_browse_index && texture_browse_index < TexMan.NumTextures())
	{
		FTexture* const texture = TexMan.ByIndex(texture_browse_index);

		screen->DrawTexture(texture, 0, 0, 
			DTA_320x200, true, DTA_TopOffset, 0, DTA_LeftOffset, 0, TAG_DONE);
		screen->DrawText(ConFont, CR_WHITE, 0, SCREENHEIGHT - ConFont->GetHeight(), texture->Name, TAG_DONE);
	}

	if (snd_drawoutput)
	{
		GSnd->DrawWaveDebug(snd_drawoutput);
	}

	if (!wipe || NoWipe < 0)
	{
		NetUpdate ();			// send out any new accumulation
		// normal update
		C_DrawConsole (hw2d);	// draw console
		M_Drawer ();			// menu is drawn even on top of everything
		FStat::PrintStat ();
		screen->Update ();		// page flip or blit buffer
	}
	else
	{
		// wipe update
		unsigned int wipestart, nowtime, diff;
		bool done;

		GSnd->SetSfxPaused(true, 1);
		I_FreezeTime(true);
		screen->WipeEndScreen ();

		wipestart = I_MSTime();
		NetUpdate();		// send out any new accumulation

		do
		{
			do
			{
				I_WaitVBL( cl_wipe_delay );
				nowtime = I_MSTime();
				diff = (nowtime - wipestart) * 40 / 1000;	// Using 35 here feels too slow.
			} while (diff < 1);
			wipestart = nowtime;
			done = screen->WipeDo (1);
			C_DrawConsole (hw2d);	// console and
			M_Drawer ();			// menu are drawn even on top of wipes
			screen->Update ();		// page flip or blit buffer
			NetUpdate ();			// [RH] not sure this is needed anymore
		} while (!done);
		screen->WipeCleanup();
		I_FreezeTime(false);
		GSnd->SetSfxPaused(false, 1);
	}

	cycles.Unclock();
	FrameCycles = cycles;
}